

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_interaction.cpp
# Opt level: O0

void Cmd_kill(FCommandLine *argv,APlayerPawn *who,int key)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  iVar2 = FCommandLine::argc(argv);
  if (iVar2 < 2) {
    uVar3 = FIntCVar::operator_cast_to_int(&dmflags2);
    if ((uVar3 & 0x400000) != 0) {
      return;
    }
    Net_WriteByte('\x0f');
  }
  else {
    bVar1 = CheckCheatmode(true);
    if (bVar1) {
      return;
    }
    pcVar4 = FCommandLine::operator[](argv,1);
    iVar2 = strcasecmp(pcVar4,"monsters");
    if (iVar2 == 0) {
      bVar1 = CheckCheatmode(true);
      if (bVar1) {
        return;
      }
      Net_WriteByte('\n');
      Net_WriteByte('\x13');
    }
    else {
      Net_WriteByte('2');
      pcVar4 = FCommandLine::operator[](argv,1);
      Net_WriteString(pcVar4);
    }
  }
  C_HideConsole();
  return;
}

Assistant:

CCMD (kill)
{
	if (argv.argc() > 1)
	{
		if (CheckCheatmode ())
			return;

		if (!stricmp (argv[1], "monsters"))
		{
			// Kill all the monsters
			if (CheckCheatmode ())
				return;

			Net_WriteByte (DEM_GENERICCHEAT);
			Net_WriteByte (CHT_MASSACRE);
		}
		else
		{
			Net_WriteByte (DEM_KILLCLASSCHEAT);
			Net_WriteString (argv[1]);
		}
	}
	else
	{
		// If suiciding is disabled, then don't do it.
		if (dmflags2 & DF2_NOSUICIDE)
			return;

		// Kill the player
		Net_WriteByte (DEM_SUICIDE);
	}
	C_HideConsole ();
}